

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cpp
# Opt level: O0

void __thiscall File_Success_Test::TestBody(File_Success_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  char *__filename;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  string *in_stack_00000080;
  AssertionResult gtest_ar_1;
  int i;
  float expected [6];
  AssertionResult gtest_ar;
  vector<float,_std::allocator<float>_> floats;
  AssertionResult gtest_ar_;
  string fn;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  AssertionResult *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  Type type;
  undefined5 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe75;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  char *in_stack_fffffffffffffe78;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *in_stack_fffffffffffffea0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  AssertionResult *in_stack_fffffffffffffeb8;
  AssertHelper *in_stack_fffffffffffffec0;
  uint local_12c;
  char local_128 [40];
  size_type local_100;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  AssertionResult local_f0;
  vector<float,_std::allocator<float>_> local_e0;
  string local_c8 [55];
  allocator<char> local_91;
  string local_90 [32];
  AssertionResult local_70 [2];
  undefined1 local_49 [33];
  string local_28 [40];
  
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffe78,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,
                               CONCAT15(in_stack_fffffffffffffe75,in_stack_fffffffffffffe70))));
  inTestDir((string *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  __s = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)__s,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,
                               CONCAT15(in_stack_fffffffffffffe75,in_stack_fffffffffffffe70))));
  uVar1 = pbrt::WriteFile((string *)gtest_ar_1._0_8_,in_stack_00000080);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffe40,(bool)in_stack_fffffffffffffe3f);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffe75,
                                                      in_stack_fffffffffffffe70))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               (char *)in_stack_fffffffffffffea8.ptr_,in_stack_fffffffffffffea0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffe75,
                                                      in_stack_fffffffffffffe70))),
               (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe5c,(char *)in_stack_fffffffffffffe50);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
    std::__cxx11::string::~string(local_c8);
    testing::Message::~Message((Message *)0x5ab9c1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5aba3c);
  pbrt::ReadFloatFile((string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_100 = std::vector<float,_std::allocator<float>_>::size(&local_e0);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (char *)in_stack_fffffffffffffe50,
             (int *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
             (unsigned_long *)in_stack_fffffffffffffe40);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!(bool)uVar3) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,in_stack_fffffffffffffe70))))
    ;
    in_stack_fffffffffffffe68 =
         testing::AssertionResult::failure_message((AssertionResult *)0x5abb3b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,in_stack_fffffffffffffe70))),
               (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe5c,(char *)in_stack_fffffffffffffe50);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
    testing::Message::~Message((Message *)0x5abb98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5abbf0);
  local_128[0] = '\0';
  local_128[1] = '\0';
  local_128[2] = -0x80;
  local_128[3] = '?';
  local_128[4] = '\0';
  local_128[5] = '\0';
  local_128[6] = ' ';
  local_128[7] = -0x40;
  local_128[8] = '\0';
  local_128[9] = '\0';
  local_128[10] = -0x6a;
  local_128[0xb] = 'C';
  local_128[0xc] = '3';
  local_128[0xd] = '3';
  local_128[0xe] = -0xd;
  local_128[0xf] = -0x42;
  local_128[0x10] = '\0';
  local_128[0x11] = '\0';
  local_128[0x12] = -0x58;
  local_128[0x13] = '@';
  local_128[0x14] = '\0';
  local_128[0x15] = '\0';
  local_128[0x16] = -0x40;
  local_128[0x17] = '@';
  for (local_12c = 0; type = (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20), local_12c < 6;
      local_12c = local_12c + 1) {
    in_stack_fffffffffffffe60 = local_128 + (long)(int)local_12c * 4;
    std::vector<float,_std::allocator<float>_>::operator[](&local_e0,(long)(int)local_12c);
    testing::internal::EqHelper<false>::Compare<float,float>
              ((char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (char *)in_stack_fffffffffffffe50,
               (float *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               (float *)in_stack_fffffffffffffe40);
    bVar4 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffec0);
    in_stack_fffffffffffffe5c = CONCAT13(bVar4,(int3)in_stack_fffffffffffffe5c);
    if (!bVar4) {
      testing::Message::Message
                ((Message *)
                 CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,in_stack_fffffffffffffe70))));
      in_stack_fffffffffffffe50 =
           (vector<float,_std::allocator<float>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x5abcea);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,in_stack_fffffffffffffe70))),
                 (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe5c,(char *)in_stack_fffffffffffffe50);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
      testing::Message::~Message((Message *)0x5abd3e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5abd90);
  }
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (char *)in_stack_fffffffffffffe50,
             (int *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
             (int *)in_stack_fffffffffffffe40,
             (type *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  bVar4 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffea0);
  if (!bVar4) {
    testing::Message::Message
              ((Message *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,in_stack_fffffffffffffe70))))
    ;
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x5abe50)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,in_stack_fffffffffffffe70))),type,
               in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,(char *)in_stack_fffffffffffffe50
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x5abe9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5abeea);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(File, Success) {
    std::string fn = inTestDir("floatfile_good.txt");
    EXPECT_TRUE(WriteFile(fn, R"(1
# comment 6632
-2.5
#6502
3e2       -4.75E-1       5.25




6
)"));

    std::vector<float> floats = ReadFloatFile(fn);
    EXPECT_EQ(6, floats.size());
    const float expected[] = {1.f, -2.5f, 300.f, -.475f, 5.25f, 6.f};
    for (int i = 0; i < PBRT_ARRAYSIZE(expected); ++i)
        EXPECT_EQ(expected[i], floats[i]);

    EXPECT_EQ(0, remove(fn.c_str()));
}